

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EllypticPoint.cpp
# Opt level: O1

void __thiscall EllypticPoint::EllypticPoint(EllypticPoint *this)

{
  BigInteger local_48;
  
  BigIntegerLibrary::BigInteger::BigInteger(&this->x);
  BigIntegerLibrary::BigInteger::BigInteger(&this->y);
  BigIntegerLibrary::BigInteger::BigInteger(&this->p,0x43);
  BigIntegerLibrary::BigInteger::BigInteger(&this->a,2);
  BigIntegerLibrary::BigInteger::BigInteger(&local_48,0);
  BigIntegerLibrary::BigInteger::operator=(&this->x,&local_48);
  if (local_48.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  BigIntegerLibrary::BigInteger::BigInteger(&local_48,0);
  BigIntegerLibrary::BigInteger::operator=(&this->y,&local_48);
  if (local_48.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.num.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

EllypticPoint::EllypticPoint() {
    x = 0;
    y = 0;
}